

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

stbtt_uint32 stbtt__buf_get(stbtt__buf *b,int n)

{
  byte bVar1;
  int in_ESI;
  stbtt__buf *in_RDI;
  int i;
  stbtt_uint32 v;
  int local_14;
  uint local_10;
  
  local_10 = 0;
  if (in_ESI < 1 || 4 < in_ESI) {
    __assert_fail("n >= 1 && n <= 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imstb_truetype.h"
                  ,0x479,"stbtt_uint32 stbtt__buf_get(stbtt__buf *, int)");
  }
  for (local_14 = 0; local_14 < in_ESI; local_14 = local_14 + 1) {
    bVar1 = stbtt__buf_get8(in_RDI);
    local_10 = local_10 << 8 | (uint)bVar1;
  }
  return local_10;
}

Assistant:

static stbtt_uint32 stbtt__buf_get(stbtt__buf *b, int n)
{
   stbtt_uint32 v = 0;
   int i;
   STBTT_assert(n >= 1 && n <= 4);
   for (i = 0; i < n; i++)
      v = (v << 8) | stbtt__buf_get8(b);
   return v;
}